

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> __thiscall
bloaty::TryOpenWebAssemblyFile
          (bloaty *this,unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file
          )

{
  InputFile *pIVar1;
  bool bVar2;
  undefined8 *puVar3;
  string_view data;
  string_view local_20;
  
  pIVar1 = (file->_M_t).
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_20._M_len = (pIVar1->data_)._M_len;
  local_20._M_str = (pIVar1->data_)._M_str;
  bVar2 = wasm::ReadMagic(&local_20);
  if (bVar2) {
    puVar3 = (undefined8 *)operator_new(0x18);
    pIVar1 = (file->_M_t).
             super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
             super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
    (file->_M_t).super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
    _M_t.super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
    super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl = (InputFile *)0x0;
    puVar3[1] = pIVar1;
    puVar3[2] = puVar3;
    *puVar3 = &PTR__ObjectFile_0062c638;
  }
  else {
    *(undefined8 *)this = 0;
    puVar3 = (undefined8 *)0x0;
  }
  *(undefined8 **)this = puVar3;
  return (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ObjectFile> TryOpenWebAssemblyFile(
    std::unique_ptr<InputFile>& file) {
  string_view data = file->data();
  if (wasm::ReadMagic(&data)) {
    return std::unique_ptr<ObjectFile>(
        new wasm::WebAssemblyObjectFile(std::move(file)));
  }

  return nullptr;
}